

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t member_type_id,
          uint32_t index,string *qualifier)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  SPIRType *type_00;
  undefined8 *puVar10;
  long *plVar11;
  SPIRVariable *pSVar12;
  SPIRType *pSVar13;
  runtime_error *prVar14;
  size_type *psVar15;
  ulong *puVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  uint uVar18;
  uint uVar19;
  char *pcVar20;
  ulong uVar21;
  undefined8 uVar22;
  uint32_t uVar23;
  SPIRType *pSVar24;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar25;
  char (*ts_7) [2];
  BuiltIn builtin;
  undefined4 uStack_294;
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  uint32_t local_278;
  ID local_274;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string __str_2;
  string array_type;
  string td_line;
  string pack_pfx;
  string __str_1;
  string __str;
  undefined1 local_180 [192];
  SmallVector<unsigned_int,_8UL> local_c0;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined1 local_68 [32];
  float local_48;
  undefined1 local_40 [16];
  
  bVar6 = CompilerGLSL::member_is_remapped_physical_type(&this->super_CompilerGLSL,type,index);
  if (bVar6) {
    member_type_id =
         Compiler::get_extended_member_decoration
                   ((Compiler *)this,(type->super_IVariant).self.id,index,
                    SPIRVCrossDecorationPhysicalTypeID);
  }
  type_00 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + member_type_id);
  pack_pfx._M_dataplus._M_p = (pointer)&pack_pfx.field_2;
  pack_pfx._M_string_length = 0;
  pack_pfx.field_2._M_local_buf[0] = '\0';
  bVar6 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,(type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationInterfaceOrigID);
  local_274.id = 0;
  if (bVar6) {
    local_274.id = Compiler::get_extended_member_decoration
                             ((Compiler *)this,(type->super_IVariant).self.id,index,
                              SPIRVCrossDecorationInterfaceOrigID);
  }
  bVar6 = Compiler::is_matrix((Compiler *)this,type_00);
  bVar7 = false;
  if (bVar6) {
    bVar7 = Compiler::has_member_decoration
                      ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,
                       DecorationRowMajor);
  }
  local_180._32_8_ = local_180 + 0x38;
  local_180._0_8_ = &PTR__SPIRType_003f9270;
  local_180._8_4_ = 0;
  local_180._12_4_ = 0;
  local_180._16_4_ = 0;
  local_180._20_4_ = 1;
  local_180._24_4_ = 1;
  local_180._40_8_ = 0;
  local_180._48_8_ = 8;
  local_180._88_8_ = local_180 + 0x70;
  local_180._96_8_ = 0;
  local_180._104_8_ = 8;
  local_180._120_8_ = (ulong)(ushort)local_180._126_2_ << 0x30;
  local_180._128_4_ = StorageClassGeneric;
  local_180._136_8_ = local_180 + 0xa0;
  local_180._144_8_ = 0;
  local_180._152_8_ = 8;
  local_c0.super_VectorView<unsigned_int>.ptr = (uint *)&local_c0.stack_storage;
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  local_c0.buffer_capacity = 8;
  local_88 = (ulong)local_88._4_4_ << 0x20;
  uStack_70._0_4_ = 0;
  uStack_70._4_4_ = 0;
  local_68._0_8_ = local_40 + 8;
  local_68._8_8_ = 1;
  local_68._16_16_ = (undefined1  [16])0x0;
  local_48 = 1.0;
  local_40 = (undefined1  [16])0x0;
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(type->super_IVariant).self.id,index,DecorationOffset)
  ;
  if ((bVar6) ||
     (bVar6 = Compiler::has_extended_member_decoration
                        ((Compiler *)this,(type->super_IVariant).self.id,index,
                         SPIRVCrossDecorationResourceIndexPrimary), bVar6)) {
    this->is_using_builtin_array = true;
  }
  bVar6 = CompilerGLSL::member_is_packed_physical_type(&this->super_CompilerGLSL,type,index);
  pSVar24 = type_00;
  if (bVar6) {
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&array_type,"Cannot emit a packed struct currently.","");
      ::std::runtime_error::runtime_error(prVar14,(string *)&array_type);
      *(undefined ***)prVar14 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar6 = Compiler::is_matrix((Compiler *)this,type_00);
    if (bVar6) {
      uVar23 = type_00->vecsize;
      local_278 = type_00->columns;
      ::std::__cxx11::string::_M_replace
                ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x36d39d);
      if (bVar7 != false) {
        local_278 = type_00->vecsize;
        uVar23 = type_00->columns;
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x376e97);
      }
      bVar6 = type_00->width == 0x10;
      pcVar20 = "float";
      if (bVar6) {
        pcVar20 = "half";
      }
      array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&array_type,pcVar20,pcVar20 + ((ulong)bVar6 ^ 5));
      td_line._M_dataplus._M_p = (pointer)&td_line.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&td_line,"typedef ","");
      ::std::operator+(&local_270,"packed_",&array_type);
      cVar8 = '\x01';
      if (9 < uVar23) {
        uVar21 = (ulong)uVar23;
        cVar5 = '\x04';
        do {
          cVar8 = cVar5;
          uVar18 = (uint)uVar21;
          if (uVar18 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_002d7e69;
          }
          if (uVar18 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_002d7e69;
          }
          if (uVar18 < 10000) goto LAB_002d7e69;
          uVar21 = uVar21 / 10000;
          cVar5 = cVar8 + '\x04';
        } while (99999 < uVar18);
        cVar8 = cVar8 + '\x01';
      }
LAB_002d7e69:
      paVar1 = &__str_2.field_2;
      __str_2._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct((ulong)&__str_2,cVar8);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,uVar23);
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar22 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < __str_2._M_string_length + local_270._M_string_length) {
        uVar22 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_2._M_dataplus._M_p != paVar1) {
          uVar22 = __str_2.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar22 < __str_2._M_string_length + local_270._M_string_length)
        goto LAB_002d7ed4;
        puVar10 = (undefined8 *)
                  ::std::__cxx11::string::replace
                            ((ulong)&__str_2,0,(char *)0x0,(ulong)local_270._M_dataplus._M_p);
      }
      else {
LAB_002d7ed4:
        puVar10 = (undefined8 *)
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_270,(ulong)__str_2._M_dataplus._M_p);
      }
      _builtin = (pointer)&local_288;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 == paVar17) {
        local_288._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_288._8_8_ = puVar10[3];
      }
      else {
        local_288._M_allocated_capacity = paVar17->_M_allocated_capacity;
        _builtin = (pointer)*puVar10;
      }
      local_290 = puVar10[1];
      *puVar10 = paVar17;
      puVar10[1] = 0;
      paVar17->_M_local_buf[0] = '\0';
      ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_builtin != &local_288) {
        operator_delete(_builtin);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar1) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin
                       ," ",&pack_pfx);
      ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_builtin != &local_288) {
        operator_delete(_builtin);
      }
      uVar18 = type_00->columns;
      cVar8 = '\x01';
      if (9 < uVar18) {
        uVar19 = uVar18;
        cVar5 = '\x04';
        do {
          cVar8 = cVar5;
          if (uVar19 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_002d8011;
          }
          if (uVar19 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_002d8011;
          }
          if (uVar19 < 10000) goto LAB_002d8011;
          bVar6 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar5 = cVar8 + '\x04';
        } while (bVar6);
        cVar8 = cVar8 + '\x01';
      }
LAB_002d8011:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      ::std::__cxx11::string::_M_construct((ulong)&__str,cVar8);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,uVar18);
      plVar11 = (long *)::std::__cxx11::string::replace
                                  ((ulong)&__str,0,(char *)0x0,(ulong)array_type._M_dataplus._M_p);
      __str_2._M_dataplus._M_p = (pointer)&__str_2.field_2;
      psVar15 = (size_type *)(plVar11 + 2);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      if ((size_type *)*plVar11 == psVar15) {
        __str_2.field_2._M_allocated_capacity = *psVar15;
        __str_2.field_2._8_8_ = plVar11[3];
      }
      else {
        __str_2.field_2._M_allocated_capacity = *psVar15;
        __str_2._M_dataplus._M_p = (pointer)*plVar11;
      }
      __str_2._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)::std::__cxx11::string::append((char *)&__str_2);
      puVar16 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_270.field_2._M_allocated_capacity = *puVar16;
        local_270.field_2._8_8_ = plVar11[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar16;
        local_270._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_270._M_string_length = plVar11[1];
      *plVar11 = (long)puVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      uVar18 = type_00->vecsize;
      cVar8 = '\x01';
      if (9 < uVar18) {
        uVar19 = uVar18;
        cVar5 = '\x04';
        do {
          cVar8 = cVar5;
          if (uVar19 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_002d8151;
          }
          if (uVar19 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_002d8151;
          }
          if (uVar19 < 10000) goto LAB_002d8151;
          bVar6 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar5 = cVar8 + '\x04';
        } while (bVar6);
        cVar8 = cVar8 + '\x01';
      }
LAB_002d8151:
      paVar1 = &__str_1.field_2;
      __str_1._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct((ulong)&__str_1,cVar8);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str_1._M_dataplus._M_p,(uint)__str_1._M_string_length,uVar18);
      uVar21 = CONCAT44(__str_1._M_string_length._4_4_,(uint)__str_1._M_string_length) +
               local_270._M_string_length;
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        uVar22 = local_270.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < uVar21) {
        uVar22 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != paVar1) {
          uVar22 = __str_1.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar22 < uVar21) goto LAB_002d81d3;
        puVar10 = (undefined8 *)
                  ::std::__cxx11::string::replace
                            ((ulong)&__str_1,0,(char *)0x0,(ulong)local_270._M_dataplus._M_p);
      }
      else {
LAB_002d81d3:
        puVar10 = (undefined8 *)
                  ::std::__cxx11::string::_M_append
                            ((char *)&local_270,(ulong)__str_1._M_dataplus._M_p);
      }
      _builtin = (pointer)&local_288;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 == paVar17) {
        local_288._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_288._8_8_ = puVar10[3];
      }
      else {
        local_288._M_allocated_capacity = paVar17->_M_allocated_capacity;
        _builtin = (pointer)*puVar10;
      }
      local_290 = puVar10[1];
      *puVar10 = paVar17;
      puVar10[1] = 0;
      paVar17->_M_local_buf[0] = '\0';
      ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_builtin != &local_288) {
        operator_delete(_builtin);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_1._M_dataplus._M_p != paVar1) {
        operator_delete(__str_1._M_dataplus._M_p);
      }
      paVar1 = &__str_2.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar1) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      cVar8 = '\x01';
      if (9 < local_278) {
        uVar23 = local_278;
        cVar5 = '\x04';
        do {
          cVar8 = cVar5;
          if (uVar23 < 100) {
            cVar8 = cVar8 + -2;
            goto LAB_002d8302;
          }
          if (uVar23 < 1000) {
            cVar8 = cVar8 + -1;
            goto LAB_002d8302;
          }
          if (uVar23 < 10000) goto LAB_002d8302;
          bVar6 = 99999 < uVar23;
          uVar23 = uVar23 / 10000;
          cVar5 = cVar8 + '\x04';
        } while (bVar6);
        cVar8 = cVar8 + '\x01';
      }
LAB_002d8302:
      __str_2._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct((ulong)&__str_2,cVar8);
      ::std::__detail::__to_chars_10_impl<unsigned_int>
                (__str_2._M_dataplus._M_p,(uint)__str_2._M_string_length,local_278);
      plVar11 = (long *)::std::__cxx11::string::replace((ulong)&__str_2,0,(char *)0x0,0x366551);
      puVar16 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_270.field_2._M_allocated_capacity = *puVar16;
        local_270.field_2._8_8_ = plVar11[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar16;
        local_270._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_270._M_string_length = plVar11[1];
      *plVar11 = (long)puVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)::std::__cxx11::string::append((char *)&local_270);
      _builtin = (pointer)&local_288;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar17) {
        local_288._M_allocated_capacity = paVar17->_M_allocated_capacity;
        local_288._8_8_ = plVar11[3];
      }
      else {
        local_288._M_allocated_capacity = paVar17->_M_allocated_capacity;
        _builtin = (pointer)*plVar11;
      }
      local_290 = plVar11[1];
      *plVar11 = (long)paVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)&td_line,(ulong)_builtin);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_builtin != &local_288) {
        operator_delete(_builtin);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_2._M_dataplus._M_p != paVar1) {
        operator_delete(__str_2._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)&td_line);
      pVar25 = ::std::
               _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               ::_M_insert_unique<std::__cxx11::string_const&>
                         ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                           *)&this->typedef_lines,&td_line);
      if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        Compiler::force_recompile((Compiler *)this);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)td_line._M_dataplus._M_p != &td_line.field_2) {
        operator_delete(td_line._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)array_type._M_dataplus._M_p != &array_type.field_2) {
        operator_delete(array_type._M_dataplus._M_p);
      }
    }
    else {
      bVar6 = Compiler::is_scalar((Compiler *)this,type_00);
      if (!bVar6) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x36d39d);
      }
    }
  }
  else {
    bVar6 = Compiler::is_matrix((Compiler *)this,type_00);
    if (bVar6) {
      if (((this->msl_options).msl_version < 30000) &&
         (bVar6 = Compiler::has_extended_decoration
                            ((Compiler *)this,(type->super_IVariant).self.id,
                             SPIRVCrossDecorationWorkgroupStruct), bVar6)) {
        ::std::__cxx11::string::_M_replace
                  ((ulong)&pack_pfx,0,(char *)pack_pfx._M_string_length,0x376eab);
        add_spv_func_and_recompile(this,SPVFuncImplStorageMatrix);
        this->is_using_builtin_array = true;
      }
      if (bVar7 != false) {
        local_180._8_4_ = (type_00->super_IVariant).self.id;
        uVar22 = *(undefined8 *)&(type_00->super_IVariant).field_0xc;
        uVar2 = type_00->vecsize;
        uVar3 = type_00->columns;
        local_180._12_4_ = (undefined4)uVar22;
        local_180._16_4_ = (undefined4)((ulong)uVar22 >> 0x20);
        local_180._20_4_ = uVar2;
        local_180._24_4_ = uVar3;
        SmallVector<unsigned_int,_8UL>::operator=
                  ((SmallVector<unsigned_int,_8UL> *)(local_180 + 0x20),&type_00->array);
        SmallVector<bool,_8UL>::operator=
                  ((SmallVector<bool,_8UL> *)(local_180 + 0x58),&type_00->array_size_literal);
        local_180._120_4_ = type_00->pointer_depth;
        local_180[0x7c] = type_00->pointer;
        local_180[0x7d] = type_00->forward_pointer;
        local_180._126_2_ = *(undefined2 *)&type_00->field_0x7e;
        local_180._128_4_ = type_00->storage;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
                   (local_180 + 0x88),&type_00->member_types);
        SmallVector<unsigned_int,_8UL>::operator=(&local_c0,&type_00->member_type_index_redirection)
        ;
        local_88._0_4_ = (type_00->image).type;
        local_88._4_4_ = (type_00->image).dim;
        uStack_80._0_1_ = (type_00->image).depth;
        uStack_80._1_1_ = (type_00->image).arrayed;
        uStack_80._2_1_ = (type_00->image).ms;
        uStack_80._3_1_ = (type_00->image).field_0xb;
        uStack_80._4_4_ = (type_00->image).sampled;
        local_78._0_4_ = (type_00->image).format;
        local_78._4_4_ = (type_00->image).access;
        uStack_70._0_4_ = (type_00->type_alias).id;
        uStack_70._4_4_ = (type_00->parent_type).id;
        if (type_00 != (SPIRType *)local_180) {
          ::std::
          _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                    ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)local_68,&(type_00->member_name_cache)._M_h);
        }
        uVar4 = local_180._20_4_;
        local_180._20_4_ = local_180._24_4_;
        local_180._24_4_ = uVar4;
        pSVar24 = (SPIRType *)local_180;
      }
    }
  }
  iVar9 = *(int *)&(type_00->super_IVariant).field_0xc;
  if ((iVar9 == 0x10) && ((type_00->image).sampled == 2)) {
    if (((this->msl_options).platform != iOS) ||
       (0 < (int)(this->msl_options).argument_buffers_tier)) {
      array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
      array_type._M_string_length = 0;
      array_type.field_2._M_local_buf[0] = '\0';
      goto LAB_002d85f3;
    }
    bVar6 = Compiler::has_decoration((Compiler *)this,local_274,DecorationNonWritable);
    if (!bVar6) {
      prVar14 = (runtime_error *)__cxa_allocate_exception(0x10);
      array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&array_type,
                 "Writable images are not allowed on Tier1 argument buffers on iOS.","");
      ::std::runtime_error::runtime_error(prVar14,(string *)&array_type);
      *(undefined ***)prVar14 = &PTR__runtime_error_003f8e68;
      __cxa_throw(prVar14,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar9 = *(int *)&(type_00->super_IVariant).field_0xc;
  }
  array_type._M_dataplus._M_p = (pointer)&array_type.field_2;
  array_type._M_string_length = 0;
  array_type.field_2._M_local_buf[0] = '\0';
  if (iVar9 - 0x10U < 3) goto LAB_002d85f3;
  builtin = 0x7fffffff;
  uVar21 = (ulong)(this->stage_out_var_id).id;
  if (uVar21 == 0) {
LAB_002d853b:
    uVar21 = (ulong)(this->stage_in_var_id).id;
    if (uVar21 != 0) {
      pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + uVar21);
      pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
      if (((pSVar13->super_IVariant).self.id == (type->super_IVariant).self.id) &&
         (bVar6 = variable_storage_requires_stage_io(this,StorageClassInput), bVar6))
      goto LAB_002d857e;
    }
  }
  else {
    pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr + uVar21);
    pSVar13 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
    if (((pSVar13->super_IVariant).self.id != (type->super_IVariant).self.id) ||
       ((this->capture_output_to_buffer & 1U) != 0)) goto LAB_002d853b;
LAB_002d857e:
    bVar6 = Compiler::is_member_builtin((Compiler *)this,type,index,&builtin);
    if (bVar6) {
      this->is_using_builtin_array = true;
    }
  }
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&td_line,this,type_00);
  ::std::__cxx11::string::operator=((string *)&array_type,(string *)&td_line);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)td_line._M_dataplus._M_p != &td_line.field_2) {
    operator_delete(td_line._M_dataplus._M_p);
  }
LAB_002d85f3:
  type_to_glsl_abi_cxx11_(&td_line,this,pSVar24,local_274.id,true);
  CompilerGLSL::to_member_name_abi_cxx11_((string *)&builtin,&this->super_CompilerGLSL,type,index);
  ts_7 = (char (*) [2])0x2d8635;
  member_attribute_qualifier_abi_cxx11_(&local_270,this,type,index);
  join<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            (__return_storage_ptr__,(spirv_cross *)&pack_pfx,&td_line,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x362d7b,
             (char (*) [2])qualifier,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builtin,
             &local_270,&array_type,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x361554,ts_7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_builtin != &local_288) {
    operator_delete(_builtin);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)td_line._M_dataplus._M_p != &td_line.field_2) {
    operator_delete(td_line._M_dataplus._M_p);
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)array_type._M_dataplus._M_p != &array_type.field_2) {
    operator_delete(array_type._M_dataplus._M_p);
  }
  local_180._0_8_ = &PTR__SPIRType_003f9270;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_68);
  local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
  if ((AlignedBuffer<unsigned_int,_8UL> *)local_c0.super_VectorView<unsigned_int>.ptr !=
      &local_c0.stack_storage) {
    free(local_c0.super_VectorView<unsigned_int>.ptr);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pack_pfx._M_dataplus._M_p != &pack_pfx.field_2) {
    operator_delete(pack_pfx._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type;
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput)));
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type);
	}

	auto result = join(pack_pfx, type_to_glsl(*declared_type, orig_id, true), " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}